

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall
cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::qstring_trait_t> *this)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  _Elt_pointer pptVar6;
  logic_error *plVar7;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_c8;
  string_t local_b0;
  string_t local_98;
  qstring_wrapper_t local_80;
  string local_68;
  string local_48;
  
  if ((this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->m_stack).c.
      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    plVar7 = (logic_error *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unexpected end of file. Still unfinished tag \"","");
    qstring_trait_t::from_ascii(&local_98,&local_48);
    pptVar6 = (this->m_stack).c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar6 ==
        (this->m_stack).c.
        super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pptVar6 = (this->m_stack).c.
                super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    operator+(&local_80,&local_98,&pptVar6[-1]->m_name);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\".","");
    qstring_trait_t::from_ascii(&local_b0,&local_68);
    operator+(&local_c8,&local_80,&local_b0);
    std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
    *(undefined ***)plVar7 = &PTR__exception_t_00147670;
    *(undefined8 *)(plVar7 + 0x10) = 0;
    *(undefined8 *)(plVar7 + 0x18) = 0;
    *(undefined8 *)(plVar7 + 0x20) = 0;
    pcVar1 = *(char16_t **)(plVar7 + 0x18);
    uVar3 = local_c8.m_str.d.d._0_4_;
    uVar4 = local_c8.m_str.d.d._4_4_;
    local_c8.m_str.d.d = (Data *)0x0;
    *(undefined4 *)(plVar7 + 0x10) = uVar3;
    *(undefined4 *)(plVar7 + 0x14) = uVar4;
    *(undefined4 *)(plVar7 + 0x18) = local_c8.m_str.d.ptr._0_4_;
    *(undefined4 *)(plVar7 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
    qVar2 = *(qsizetype *)(plVar7 + 0x20);
    *(qsizetype *)(plVar7 + 0x20) = local_c8.m_str.d.size;
    local_c8.m_str.d.ptr = pcVar1;
    local_c8.m_str.d.size = qVar2;
    __cxa_throw(plVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  if (this->m_tag->m_is_mandatory == true) {
    bVar5 = tag_t<cfgfile::qstring_trait_t>::is_defined(this->m_tag);
    if (!bVar5) {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x28);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Undefined mandatory tag: \"","");
      qstring_trait_t::from_ascii(&local_98,&local_48);
      operator+(&local_80,&local_98,&this->m_tag->m_name);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"\".","");
      qstring_trait_t::from_ascii(&local_b0,&local_68);
      operator+(&local_e8,&local_80,&local_b0);
      std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
      *(undefined ***)plVar7 = &PTR__exception_t_00147670;
      *(undefined8 *)(plVar7 + 0x10) = 0;
      *(undefined8 *)(plVar7 + 0x18) = 0;
      *(undefined8 *)(plVar7 + 0x20) = 0;
      pcVar1 = *(char16_t **)(plVar7 + 0x18);
      uVar3 = local_e8.m_str.d.d._0_4_;
      uVar4 = local_e8.m_str.d.d._4_4_;
      local_e8.m_str.d.d = (Data *)0x0;
      *(undefined4 *)(plVar7 + 0x10) = uVar3;
      *(undefined4 *)(plVar7 + 0x14) = uVar4;
      *(undefined4 *)(plVar7 + 0x18) = local_e8.m_str.d.ptr._0_4_;
      *(undefined4 *)(plVar7 + 0x1c) = local_e8.m_str.d.ptr._4_4_;
      qVar2 = *(qsizetype *)(plVar7 + 0x20);
      *(qsizetype *)(plVar7 + 0x20) = local_e8.m_str.d.size;
      local_e8.m_str.d.ptr = pcVar1;
      local_e8.m_str.d.size = qVar2;
      __cxa_throw(plVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}